

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>
fmt::v5::internal::
format_decimal<char,unsigned_long,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::add_thousands_sep<char>>
          (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> out,
          unsigned_long value,int num_digits,add_thousands_sep<char> sep)

{
  add_thousands_sep<char> thousands_sep;
  type tVar1;
  char *in_stack_00000008;
  char *in_stack_00000010;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_00000018;
  char *end;
  char_type buffer [26];
  unsigned_long in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8 [16];
  
  thousands_sep._8_16_ = in_stack_ffffffffffffffc8;
  thousands_sep.sep_.data_ = in_stack_ffffffffffffffc0;
  format_decimal<unsigned_long,char,fmt::v5::internal::add_thousands_sep<char>>
            (in_stack_00000008,in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_00000018.container >> 0x20),thousands_sep);
  tVar1 = copy_str<char,char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (in_stack_00000010,in_stack_00000008,in_stack_00000018);
  return (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)tVar1.container;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}